

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QString * encodeByteArray(QString *__return_storage_ptr__,QCborContainerPrivate *d,qsizetype idx,
                         QCborTag encoding)

{
  Data *pDVar1;
  Data *data;
  char *pcVar2;
  undefined8 *puVar3;
  QString *pQVar4;
  long in_R8;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArray local_48;
  QByteArray local_28;
  QString *local_10;
  
  local_10 = *(QString **)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(idx + 0xc + encoding * 0x10) & 2) == 0) {
    pQVar4 = *(QString **)(in_FS_OFFSET + 0x28);
    if (pQVar4 != local_10) {
LAB_002ee9a0:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (d == (QCborContainerPrivate *)0x0) {
      d = (QCborContainerPrivate *)&QByteArray::_empty;
    }
    puVar3 = (undefined8 *)
             ((long)&(d->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
             *(long *)(idx + encoding * 0x10));
    local_28.d.ptr = (char *)(puVar3 + 1);
    local_28.d.size = *puVar3;
    local_28.d.d = (Data *)0x0;
    if (in_R8 == 0x16) {
      QByteArray::toBase64(&local_48,&local_28,(Base64Options)0x0);
    }
    else if (in_R8 == 0x17) {
      QByteArray::toHex(&local_48,&local_28,'\0');
    }
    else {
      QByteArray::toBase64(&local_48,&local_28,(Base64Options)0x3);
    }
    pcVar2 = local_28.d.ptr;
    data = local_28.d.d;
    pQVar4 = (QString *)local_48.d.size;
    pDVar1 = local_48.d.d;
    local_48.d.d = local_28.d.d;
    local_28.d.d = pDVar1;
    local_28.d.ptr = local_48.d.ptr;
    local_48.d.ptr = pcVar2;
    local_48.d.size = local_28.d.size;
    local_28.d.size = (qsizetype)pQVar4;
    if (&data->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&data->super_QArrayData,1,0x10);
      }
    }
    ba.m_data = (storage_type *)pQVar4;
    ba.m_size = (qsizetype)local_28.d.ptr;
    QString::fromLatin1(__return_storage_ptr__,(QString *)local_28.d.size,ba);
    if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,1,0x10);
      }
    }
    pQVar4 = *(QString **)(in_FS_OFFSET + 0x28);
    if (pQVar4 != local_10) goto LAB_002ee9a0;
  }
  return pQVar4;
}

Assistant:

static QString encodeByteArray(const QCborContainerPrivate *d, qsizetype idx, QCborTag encoding)
{
    const ByteData *b = d->byteData(idx);
    if (!b)
        return QString();

    QByteArray data = QByteArray::fromRawData(b->byte(), b->len);
    if (encoding == QCborKnownTags::ExpectedBase16)
        data = data.toHex();
    else if (encoding == QCborKnownTags::ExpectedBase64)
        data = data.toBase64();
    else
        data = data.toBase64(QByteArray::Base64UrlEncoding | QByteArray::OmitTrailingEquals);

    return QString::fromLatin1(data);
}